

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O3

shared_ptr<gui::Style> __thiscall
gui::DefaultTheme::loadStyle(DefaultTheme *this,String *widgetName)

{
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  *paVar1;
  bool bVar2;
  String *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<gui::ButtonStyle> sVar4;
  shared_ptr<gui::ChatBoxStyle> sVar5;
  shared_ptr<gui::CheckBoxStyle> sVar6;
  shared_ptr<gui::ColorPickerStyle> sVar7;
  shared_ptr<gui::DialogBoxStyle> sVar8;
  shared_ptr<gui::LabelStyle> sVar9;
  shared_ptr<gui::MenuBarStyle> sVar10;
  shared_ptr<gui::MultilineTextBoxStyle> sVar11;
  shared_ptr<gui::PanelStyle> sVar12;
  shared_ptr<gui::RadioButtonStyle> sVar13;
  shared_ptr<gui::SliderStyle> sVar14;
  shared_ptr<gui::TextBoxStyle> sVar15;
  shared_ptr<gui::Style> sVar16;
  locale local_60 [8];
  String local_58;
  
  std::locale::locale(local_60);
  sf::String::String(&local_58,"Button",local_60);
  bVar2 = sf::operator==(in_RDX,&local_58);
  paVar1 = &local_58.m_string.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,local_58.m_string._M_dataplus._M_p._0_4_)
      != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                             local_58.m_string._M_dataplus._M_p._0_4_));
  }
  std::locale::~locale(local_60);
  if (bVar2) {
    sVar4 = makeButtonStyle((DefaultTheme *)&local_58);
    _Var3 = sVar4.super___shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
  }
  else {
    std::locale::locale(local_60);
    sf::String::String(&local_58,"ChatBox",local_60);
    bVar2 = sf::operator==(in_RDX,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                    local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                               local_58.m_string._M_dataplus._M_p._0_4_));
    }
    std::locale::~locale(local_60);
    if (bVar2) {
      sVar5 = makeChatBoxStyle((DefaultTheme *)&local_58);
      _Var3 = sVar5.super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    }
    else {
      std::locale::locale(local_60);
      sf::String::String(&local_58,"CheckBox",local_60);
      bVar2 = sf::operator==(in_RDX,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
           *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                      local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                 local_58.m_string._M_dataplus._M_p._0_4_));
      }
      std::locale::~locale(local_60);
      if (bVar2) {
        sVar6 = makeCheckBoxStyle((DefaultTheme *)&local_58);
        _Var3 = sVar6.super___shared_ptr<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
      }
      else {
        std::locale::locale(local_60);
        sf::String::String(&local_58,"ColorPicker",local_60);
        bVar2 = sf::operator==(in_RDX,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
             *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                        local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
          operator_delete((undefined1 *)
                          CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                   local_58.m_string._M_dataplus._M_p._0_4_));
        }
        std::locale::~locale(local_60);
        if (bVar2) {
          sVar7 = makeColorPickerStyle((DefaultTheme *)&local_58);
          _Var3 = sVar7.super___shared_ptr<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        }
        else {
          std::locale::locale(local_60);
          sf::String::String(&local_58,"DialogBox",local_60);
          bVar2 = sf::operator==(in_RDX,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
               *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                          local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
            operator_delete((undefined1 *)
                            CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                     local_58.m_string._M_dataplus._M_p._0_4_));
          }
          std::locale::~locale(local_60);
          if (bVar2) {
            sVar8 = makeDialogBoxStyle((DefaultTheme *)&local_58);
            _Var3 = sVar8.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          }
          else {
            std::locale::locale(local_60);
            sf::String::String(&local_58,"Label",local_60);
            bVar2 = sf::operator==(in_RDX,&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                 *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                            local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
              operator_delete((undefined1 *)
                              CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                       local_58.m_string._M_dataplus._M_p._0_4_));
            }
            std::locale::~locale(local_60);
            if (bVar2) {
              sVar9 = makeLabelStyle((DefaultTheme *)&local_58);
              _Var3 = sVar9.super___shared_ptr<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            }
            else {
              std::locale::locale(local_60);
              sf::String::String(&local_58,"MenuBar",local_60);
              bVar2 = sf::operator==(in_RDX,&local_58);
              if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                   *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                              local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
                operator_delete((undefined1 *)
                                CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                         local_58.m_string._M_dataplus._M_p._0_4_));
              }
              std::locale::~locale(local_60);
              if (bVar2) {
                sVar10 = makeMenuBarStyle((DefaultTheme *)&local_58);
                _Var3 = sVar10.super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
              }
              else {
                std::locale::locale(local_60);
                sf::String::String(&local_58,"MultilineTextBox",local_60);
                bVar2 = sf::operator==(in_RDX,&local_58);
                if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                     *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                           local_58.m_string._M_dataplus._M_p._0_4_));
                }
                std::locale::~locale(local_60);
                if (bVar2) {
                  sVar11 = makeMultilineTextBoxStyle((DefaultTheme *)&local_58);
                  _Var3 = sVar11.
                          super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
                }
                else {
                  std::locale::locale(local_60);
                  sf::String::String(&local_58,"Panel",local_60);
                  bVar2 = sf::operator==(in_RDX,&local_58);
                  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                       *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                  local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
                    operator_delete((undefined1 *)
                                    CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                             local_58.m_string._M_dataplus._M_p._0_4_));
                  }
                  std::locale::~locale(local_60);
                  if (bVar2) {
                    sVar12 = makePanelStyle((DefaultTheme *)&local_58);
                    _Var3 = sVar12.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
                  }
                  else {
                    std::locale::locale(local_60);
                    sf::String::String(&local_58,"RadioButton",local_60);
                    bVar2 = sf::operator==(in_RDX,&local_58);
                    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                         *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                    local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
                      operator_delete((undefined1 *)
                                      CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                               local_58.m_string._M_dataplus._M_p._0_4_));
                    }
                    std::locale::~locale(local_60);
                    if (bVar2) {
                      sVar13 = makeRadioButtonStyle((DefaultTheme *)&local_58);
                      _Var3 = sVar13.
                              super___shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                    }
                    else {
                      std::locale::locale(local_60);
                      sf::String::String(&local_58,"Slider",local_60);
                      bVar2 = sf::operator==(in_RDX,&local_58);
                      if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                           *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                      local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                                 local_58.m_string._M_dataplus._M_p._0_4_));
                      }
                      std::locale::~locale(local_60);
                      if (bVar2) {
                        sVar14 = makeSliderStyle((DefaultTheme *)&local_58);
                        _Var3 = sVar14.
                                super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi;
                      }
                      else {
                        std::locale::locale(local_60);
                        sf::String::String(&local_58,"TextBox",local_60);
                        bVar2 = sf::operator==(in_RDX,&local_58);
                        if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                             *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                        local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                                   local_58.m_string._M_dataplus._M_p._0_4_));
                        }
                        std::locale::~locale(local_60);
                        if (bVar2) {
                          sVar15 = makeTextBoxStyle((DefaultTheme *)&local_58);
                          _Var3 = sVar15.
                                  super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                        }
                        else {
                          local_58.m_string._M_dataplus._M_p._0_4_ = 0;
                          local_58.m_string._M_dataplus._M_p._4_4_ = 0;
                          local_58.m_string._M_string_length._0_4_ = 0;
                          local_58.m_string._M_string_length._4_4_ = 0;
                          _Var3._M_pi = extraout_RDX;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *(undefined4 *)&(this->super_Theme)._vptr_Theme = local_58.m_string._M_dataplus._M_p._0_4_;
  *(undefined4 *)((long)&(this->super_Theme)._vptr_Theme + 4) =
       local_58.m_string._M_dataplus._M_p._4_4_;
  *(undefined4 *)&(this->super_Theme).gui_ = (undefined4)local_58.m_string._M_string_length;
  *(undefined4 *)((long)&(this->super_Theme).gui_ + 4) = local_58.m_string._M_string_length._4_4_;
  sVar16.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar16.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<gui::Style>)sVar16.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Style> DefaultTheme::loadStyle(const sf::String& widgetName) const {
    GUI_DEBUG << "Loading style for \"" << widgetName.toAnsiString() << "\".\n";
    if (widgetName == "Button") {
        return makeButtonStyle();
    } else if (widgetName == "ChatBox") {
        return makeChatBoxStyle();
    } else if (widgetName == "CheckBox") {
        return makeCheckBoxStyle();
    } else if (widgetName == "ColorPicker") {
        return makeColorPickerStyle();
    } else if (widgetName == "DialogBox") {
        return makeDialogBoxStyle();
    } else if (widgetName == "Label") {
        return makeLabelStyle();
    } else if (widgetName == "MenuBar") {
        return makeMenuBarStyle();
    } else if (widgetName == "MultilineTextBox") {
        return makeMultilineTextBoxStyle();
    } else if (widgetName == "Panel") {
        return makePanelStyle();
    } else if (widgetName == "RadioButton") {
        return makeRadioButtonStyle();
    } else if (widgetName == "Slider") {
        return makeSliderStyle();
    } else if (widgetName == "TextBox") {
        return makeTextBoxStyle();
    }

    // Normally if we don't find the widget, then fall back to the base class
    // version. In this case the base class doesn't implement it though.
    //return Theme::loadStyle(widgetName);
    return nullptr;
}